

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeDropTable(Btree *p,int iTable,int *piMoved)

{
  int iVar1;
  int *in_stack_00000008;
  int rc;
  undefined4 in_stack_00000018;
  
  sqlite3BtreeEnter((Btree *)0x14bdec);
  iVar1 = btreeDropTable((Btree *)CONCAT44(iTable,in_stack_00000018),piMoved._4_4_,in_stack_00000008
                        );
  sqlite3BtreeLeave((Btree *)0x14be0d);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDropTable(Btree *p, int iTable, int *piMoved){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeDropTable(p, iTable, piMoved);
  sqlite3BtreeLeave(p);
  return rc;
}